

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::PathTypeHandlerBase::InitializeExistingPath
          (PathTypeHandlerBase *this,PropertyIndex slotIndex,PropertyIndex objectSlotCount,
          ScriptContext *scriptContext)

{
  byte bVar1;
  TypePath *this_00;
  ThreadContext *this_01;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  PropertyRecord *pPVar5;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x1f9,"(scriptContext)","scriptContext");
    if (!bVar3) goto LAB_00c4833f;
    *puVar4 = 0;
  }
  this_00 = (this->typePath).ptr;
  bVar1 = ((this_00->data).ptr)->maxInitializedLength;
  if (bVar1 <= slotIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x1fc,"(slotIndex < typePath->GetMaxInitializedLength())",
                                "slotIndex < typePath->GetMaxInitializedLength()");
    if (!bVar3) goto LAB_00c4833f;
    *puVar4 = 0;
    bVar1 = ((this_00->data).ptr)->maxInitializedLength;
  }
  if (bVar1 < objectSlotCount) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x1fd,"(objectSlotCount <= typePath->GetMaxInitializedLength())",
                                "objectSlotCount <= typePath->GetMaxInitializedLength()");
    if (!bVar3) goto LAB_00c4833f;
    *puVar4 = 0;
  }
  bVar3 = TypePath::GetIsUsedFixedFieldAt(this_00,slotIndex,(uint)objectSlotCount);
  if (bVar3) {
    this_01 = scriptContext->threadContext;
    pPVar5 = TypePath::GetPropertyIdUnchecked(this_00,(uint)slotIndex);
    ThreadContext::InvalidatePropertyGuards(this_01,pPVar5->pid);
  }
  TypePath::ClearIsFixedFieldAt(this_00,slotIndex,(uint)objectSlotCount);
  bVar3 = HasOnlyInitializedNonFixedProperties(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x20d,"(HasOnlyInitializedNonFixedProperties( ))",
                                "HasOnlyInitializedNonFixedProperties( )");
    if (!bVar3) goto LAB_00c4833f;
    *puVar4 = 0;
  }
  bVar3 = HasSingletonInstanceOnlyIfNeeded(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x20e,"(HasSingletonInstanceOnlyIfNeeded( ))",
                                "HasSingletonInstanceOnlyIfNeeded( )");
    if (!bVar3) {
LAB_00c4833f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (((this_00->data).ptr)->maxInitializedLength == objectSlotCount) {
    (this_00->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  }
  return;
}

Assistant:

void PathTypeHandlerBase::InitializeExistingPath(
        const PropertyIndex slotIndex,
        const PropertyIndex objectSlotCount,
        ScriptContext *const scriptContext)
    {
        Assert(scriptContext);

        TypePath *const typePath = GetTypePath();
        Assert(slotIndex < typePath->GetMaxInitializedLength());
        Assert(objectSlotCount <= typePath->GetMaxInitializedLength());

        if(typePath->GetIsUsedFixedFieldAt(slotIndex, objectSlotCount))
        {
            // We are adding a new value where some other instance already has an existing value.  If this is a fixed
            // field we must clear the bit. If the value was hard coded in the JIT-ed code, we must invalidate the guards.

            // Invalidate any JIT-ed code that hard coded this method. No need to invalidate store field
            // inline caches (which might quitely overwrite this fixed fields, because they have never been populated.
            scriptContext->GetThreadContext()->InvalidatePropertyGuards(typePath->GetPropertyIdUnchecked(slotIndex)->GetPropertyId());
        }

        // If we're overwriting an existing value of this property, we don't consider the new one fixed.
        // This also means that it's ok to populate the inline caches for this property from now on.
        typePath->ClearIsFixedFieldAt(slotIndex, objectSlotCount);

        Assert(HasOnlyInitializedNonFixedProperties(/*typePath, objectSlotCount*/));
        Assert(HasSingletonInstanceOnlyIfNeeded(/*typePath*/));
        if(objectSlotCount == typePath->GetMaxInitializedLength())
        {
            // We have now reached the most advanced instance along this path.  If this instance is not the singleton instance,
            // then the former singleton instance (if any) is no longer a singleton.  This instance could be the singleton
            // instance, if we just happen to set (overwrite) its last property.

            // This is perhaps the most fragile point of fixed fields on path types.  If we cleared the singleton instance
            // while some fields remained fixed, the instance would be collectible, and yet some code would expect to see
            // values and call methods on it.  Clearly, a recipe for disaster.  We rely on the fact that we always add
            // properties to (pre-initialized) type handlers in the order they appear on the type path.  By the time
            // we reach the singleton instance, all fixed fields will have been invalidated.  Otherwise, some fields
            // could remain fixed (or even uninitialized) and we would have to spin off a loop here to invalidate any
            // remaining fixed fields - a rather unfortunate overhead.
            typePath->ClearSingletonInstance();
        }
    }